

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::goToUrl(QFileDialogPrivate *this,QUrl *url)

{
  QString *pQVar1;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QString **)(this->model + 8);
  QUrl::toLocalFile();
  QFileSystemModelPrivate::node(pQVar1,SUB81(&local_38,0));
  if ((QArrayData *)local_38._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_38._0_8_,2,0x10);
    }
  }
  local_38.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModelPrivate::index((QFileSystemNode *)&local_38,(int)*(undefined8 *)(this->model + 8))
  ;
  enterDirectory(this,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::goToUrl(const QUrl &url)
{
    //The shortcut in the side bar may have a parent that is not fetched yet (e.g. an hidden file)
    //so we force the fetching
    QFileSystemModelPrivate::QFileSystemNode *node = model->d_func()->node(url.toLocalFile(), true);
    QModelIndex idx =  model->d_func()->index(node);
    enterDirectory(idx);
}